

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req_parse.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* request_parse(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *__return_storage_ptr__,string *request)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  a_00;
  bool bVar1;
  sregex_iterator i;
  sregex_iterator words_end;
  sregex_iterator words_begin;
  regex re;
  smatch a;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
  local_e8;
  regex_iterator_implementation<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
  *local_d8;
  shared_count asStack_d0 [2];
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
  local_c0;
  string_type local_b0;
  basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> local_90;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_80;
  
  boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::basic_regex
            (&local_90,"(\\w+)",0);
  a_00._M_current = (request->_M_dataplus)._M_p;
  boost::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
  ::regex_iterator(&local_c0,a_00,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(a_00._M_current + request->_M_string_length),&local_90,format_default);
  local_d8 = (regex_iterator_implementation<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
              *)0x0;
  asStack_d0[0].pi_ = (sp_counted_base *)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.pdata.px = local_c0.pdata.px;
  local_e8.pdata.pn.pi_ = local_c0.pdata.pn.pi_;
  if (local_c0.pdata.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_c0.pdata.pn.pi_)->use_count_ = (local_c0.pdata.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  while( true ) {
    if ((local_e8.pdata.px ==
         (regex_iterator_implementation<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
          *)0x0) ||
       (local_d8 ==
        (regex_iterator_implementation<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
         *)0x0)) {
      bVar1 = local_e8.pdata.px == local_d8;
    }
    else {
      bVar1 = boost::
              regex_iterator_implementation<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
              ::compare(local_e8.pdata.px,local_d8);
    }
    if (bVar1 != false) break;
    if (local_e8.pdata.px ==
        (regex_iterator_implementation<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
         *)0x0) {
      __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::regex_iterator_implementation<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, char, boost::regex_traits<char>>>::operator->() const [T = boost::regex_iterator_implementation<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, char, boost::regex_traits<char>>]"
                   );
    }
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results(&local_80,&(local_e8.pdata.px)->what);
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_b0,&local_80,0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results(&local_80);
    boost::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
    ::operator++(&local_e8);
  }
  boost::detail::shared_count::~shared_count(&local_e8.pdata.pn);
  boost::detail::shared_count::~shared_count(asStack_d0);
  boost::detail::shared_count::~shared_count(&local_c0.pdata.pn);
  boost::detail::shared_count::~shared_count(&local_90.m_pimpl.pn);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> request_parse(std::string request){

    boost::regex re("(\\w+)");
    boost::sregex_iterator words_begin = boost::sregex_iterator(
        request.begin(), request.end(), re);
    boost::sregex_iterator words_end = boost::sregex_iterator();

    //boost::smatch sm;
    std::vector<std::string> result;
    for(boost::sregex_iterator i = words_begin;i!=words_end;++i){
        boost::smatch a = *i;
        result.push_back(a.str());
    }
    return result;

}